

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

ParamType * __thiscall
testing::WithParamInterface<gurkenlaeufer::Scenario>::GetParam
          (WithParamInterface<gurkenlaeufer::Scenario> *this)

{
  bool bVar1;
  ostream *poVar2;
  GTestLog local_14;
  WithParamInterface<gurkenlaeufer::Scenario> *local_10;
  WithParamInterface<gurkenlaeufer::Scenario> *this_local;
  
  local_10 = this;
  bVar1 = internal::IsTrue(parameter_ != (ParamType *)0x0);
  if (!bVar1) {
    internal::GTestLog::GTestLog
              (&local_14,GTEST_FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/paulelsner[P]gurkenlaeufer/gtest/include/gtest/gtest.h"
               ,0x4f83);
    poVar2 = internal::GTestLog::GetStream(&local_14);
    poVar2 = std::operator<<(poVar2,"Condition parameter_ != NULL failed. ");
    poVar2 = std::operator<<(poVar2,
                             "GetParam() can only be called inside a value-parameterized test ");
    std::operator<<(poVar2,"-- did you intend to write TEST_P instead of TEST_F?");
    internal::GTestLog::~GTestLog(&local_14);
  }
  return parameter_;
}

Assistant:

const ParamType& GetParam() const {
    GTEST_CHECK_(parameter_ != NULL)
        << "GetParam() can only be called inside a value-parameterized test "
        << "-- did you intend to write TEST_P instead of TEST_F?";
    return *parameter_;
  }